

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall
cmServer::WriteJsonObject(cmServer *this,cmConnection *connection,Value *jsonValue,DebugInfo *debug)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  Value *pVVar4;
  DebugInfo *__n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string result;
  Value copy;
  FastWriter writer;
  Value local_308;
  Value local_2e0;
  Value local_2b8;
  Value local_290;
  Value local_268;
  undefined1 local_240 [32];
  Value stats;
  
  __n = debug;
  Json::FastWriter::FastWriter(&writer);
  uVar1 = uv_hrtime();
  Json::FastWriter::write_abi_cxx11_((FastWriter *)&result,(int)&writer,jsonValue,(size_t)__n);
  if (debug != (DebugInfo *)0x0) {
    Json::Value::Value(&copy,jsonValue);
    if (debug->PrintStatistics == true) {
      Json::Value::Value(&stats,objectValue);
      uVar2 = uv_hrtime();
      lVar3 = uVar2 - uVar1;
      auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = 0x45300000;
      Json::Value::Value(&local_268,
                         ((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar4 = Json::Value::operator[](&stats,"jsonSerialization");
      Json::Value::operator=(pVVar4,&local_268);
      Json::Value::~Value(&local_268);
      lVar3 = uVar2 - debug->StartTime;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      Json::Value::Value(&local_290,
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar4 = Json::Value::operator[](&stats,"totalTime");
      Json::Value::operator=(pVVar4,&local_290);
      Json::Value::~Value(&local_290);
      Json::Value::Value(&local_2b8,(Int)result._M_string_length);
      pVVar4 = Json::Value::operator[](&stats,"size");
      Json::Value::operator=(pVVar4,&local_2b8);
      Json::Value::~Value(&local_2b8);
      if ((debug->OutputFile)._M_string_length != 0) {
        Json::Value::Value(&local_2e0,&debug->OutputFile);
        pVVar4 = Json::Value::operator[](&stats,"dumpFile");
        Json::Value::operator=(pVVar4,&local_2e0);
        Json::Value::~Value(&local_2e0);
      }
      Json::Value::Value(&local_308,&stats);
      pVVar4 = Json::Value::operator[](&copy,"zzzDebug");
      Json::Value::operator=(pVVar4,&local_308);
      Json::Value::~Value(&local_308);
      Json::FastWriter::write_abi_cxx11_((FastWriter *)local_240,(int)&writer,&copy,(size_t)__n);
      std::__cxx11::string::operator=((string *)&result,(string *)local_240);
      std::__cxx11::string::~string((string *)local_240);
      Json::Value::~Value(&stats);
    }
    if ((debug->OutputFile)._M_string_length != 0) {
      std::ofstream::ofstream(&stats,(debug->OutputFile)._M_dataplus._M_p,_S_out);
      std::operator<<((ostream *)&stats,(string *)&result);
      std::ofstream::~ofstream(&stats);
    }
    Json::Value::~Value(&copy);
  }
  (**connection->_vptr_cmConnection)(connection,&result);
  std::__cxx11::string::~string((string *)&result);
  Json::FastWriter::~FastWriter(&writer);
  return;
}

Assistant:

void cmServer::WriteJsonObject(cmConnection* connection,
                               const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  Json::FastWriter writer;

  auto beforeJson = uv_hrtime();
  std::string result = writer.write(jsonValue);

  if (debug) {
    Json::Value copy = jsonValue;
    if (debug->PrintStatistics) {
      Json::Value stats = Json::objectValue;
      auto endTime = uv_hrtime();

      stats["jsonSerialization"] = double(endTime - beforeJson) / 1000000.0;
      stats["totalTime"] = double(endTime - debug->StartTime) / 1000000.0;
      stats["size"] = static_cast<int>(result.size());
      if (!debug->OutputFile.empty()) {
        stats["dumpFile"] = debug->OutputFile;
      }

      copy["zzzDebug"] = stats;

      result = writer.write(copy); // Update result to include debug info
    }

    if (!debug->OutputFile.empty()) {
      cmsys::ofstream myfile(debug->OutputFile.c_str());
      myfile << result;
    }
  }

  connection->WriteData(result);
}